

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

span<const_long> __thiscall libtorrent::session_stats_alert::counters(session_stats_alert *this)

{
  span<const_long> sVar1;
  
  sVar1.m_len = 299;
  sVar1.m_ptr = (this->values)._M_elems;
  return sVar1;
}

Assistant:

span<std::int64_t const> session_stats_alert::counters() const
	{
#if TORRENT_ABI_VERSION == 1
		return values;
#else
		return { align_pointer<std::int64_t const>(m_alloc.get().ptr(m_counters_idx))
			, counters::num_counters };
#endif
	}